

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O1

QPropertyAdaptorSlotObject * __thiscall
QObjectPrivate::getPropertyAdaptorSlotObject(QObjectPrivate *this,QMetaProperty *property)

{
  __pointer_type pCVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  QPropertyAdaptorSlotObject *p;
  QPropertyAdaptorSlotObject *pQVar5;
  long in_FS_OFFSET;
  QMetaObject *metaObject;
  QMetaObject *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar1 = (this->connections).super_QBasicAtomicPointer<QObjectPrivate::ConnectionData>._q_value.
           _M_b._M_p;
  if (pCVar1 != (__pointer_type)0x0) {
    iVar3 = (**((this->super_QObjectData).q_ptr)->_vptr_QObject)();
    local_40 = (QMetaObject *)CONCAT44(extraout_var,iVar3);
    iVar3 = QMetaProperty::notifySignalIndex(property);
    iVar3 = methodIndexToSignalIndex(&local_40,iVar3);
    if ((pCVar1->signalVector).super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value._M_b
        ._M_p == (__pointer_type)0x0) {
      iVar4 = -1;
    }
    else {
      iVar4 = (int)((pCVar1->signalVector).super_QBasicAtomicPointer<QObjectPrivate::SignalVector>.
                    _q_value._M_b._M_p)->allocated;
    }
    if (iVar3 < iVar4) {
      for (lVar2 = *(long *)&(pCVar1->signalVector).
                             super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value._M_b.
                             _M_p[(long)iVar3 + 2].super_ConnectionOrSignalVector; lVar2 != 0;
          lVar2 = *(long *)(lVar2 + 0x10)) {
        if ((*(byte *)(lVar2 + 0x57) & 0x20) != 0) {
          pQVar5 = *(QPropertyAdaptorSlotObject **)(lVar2 + 0x38);
          iVar3 = QMetaProperty::propertyIndex(property);
          if (((pQVar5->super_QSlotObjectBase).m_impl != QtPrivate::QPropertyAdaptorSlotObject::impl
              ) || (iVar4 = QMetaProperty::propertyIndex(&pQVar5->metaProperty_), iVar4 != iVar3)) {
            pQVar5 = (QPropertyAdaptorSlotObject *)0x0;
          }
          if (pQVar5 != (QPropertyAdaptorSlotObject *)0x0) goto LAB_002bcee1;
        }
      }
    }
  }
  pQVar5 = (QPropertyAdaptorSlotObject *)0x0;
LAB_002bcee1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pQVar5;
}

Assistant:

QtPrivate::QPropertyAdaptorSlotObject *
QObjectPrivate::getPropertyAdaptorSlotObject(const QMetaProperty &property)
{
    if (auto conns = connections.loadAcquire()) {
        Q_Q(QObject);
        const QMetaObject *metaObject = q->metaObject();
        int signal_index = methodIndexToSignalIndex(&metaObject, property.notifySignalIndex());
        if (signal_index >= conns->signalVectorCount())
            return nullptr;
        const auto &connectionList = conns->connectionsForSignal(signal_index);
        for (auto c = connectionList.first.loadRelaxed(); c;
             c = c->nextConnectionList.loadRelaxed()) {
            if (c->isSlotObject) {
                if (auto p = QtPrivate::QPropertyAdaptorSlotObject::cast(c->slotObj,
                                                                         property.propertyIndex()))
                    return p;
            }
        }
    }
    return nullptr;
}